

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwUpdateGamepadMappings(char *string)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  _GLFWmapping *p_Var16;
  char cVar17;
  char *pcVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  _GLFWmapping mapping;
  char line [1024];
  char *local_6a0;
  int local_694;
  byte local_68d [128];
  undefined8 local_60d;
  undefined8 uStack_605;
  undefined8 local_5fd;
  undefined8 uStack_5f5;
  undefined1 local_5ec [4];
  undefined1 local_5e8 [4];
  undefined1 local_5e4 [4];
  undefined1 local_5e0 [4];
  undefined1 local_5dc [4];
  undefined1 local_5d8 [4];
  undefined1 local_5d4 [4];
  undefined1 local_5d0 [4];
  undefined1 local_5cc [4];
  undefined1 local_5c8 [4];
  undefined1 local_5c4 [4];
  undefined1 local_5c0 [4];
  undefined1 local_5bc [4];
  undefined1 local_5b8 [4];
  undefined1 local_5b4 [4];
  undefined1 local_5b0 [4];
  undefined1 local_5ac [4];
  undefined1 local_5a8 [4];
  undefined1 local_5a4 [4];
  undefined8 local_5a0;
  char *local_598 [35];
  long local_480;
  char *local_478;
  undefined1 *local_470;
  char *local_468;
  undefined1 *local_460;
  char *local_458;
  undefined1 *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  char local_418;
  char local_417 [999];
  
  if (_glfw.initialized == 0) {
    iVar11 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    bVar20 = *string;
    while (bVar20 != 0) {
      if (((byte)(bVar20 - 0x30) < 10) ||
         ((bVar20 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar20 - 0x41) & 0x3f) & 1) != 0))))
      {
        sVar12 = strcspn(string,"\r\n");
        if (sVar12 < 0x400) {
          memset(local_68d,0,0xf5);
          memcpy(&local_438,string,sVar12);
          *(undefined1 *)((long)&local_438 + sVar12) = 0;
          local_598[0] = "platform";
          local_598[1] = (char *)0x0;
          local_598[2] = "a";
          local_598[3] = local_5ec;
          local_598[4] = "b";
          local_598[5] = local_5e8;
          local_598[6] = "x";
          local_598[7] = local_5e4;
          local_598[8] = "y";
          local_598[9] = local_5e0;
          local_598[10] = "back";
          local_598[0xb] = local_5d4;
          local_598[0xc] = "start";
          local_598[0xd] = local_5d0;
          local_598[0xe] = "guide";
          local_598[0xf] = local_5cc;
          local_598[0x10] = "leftshoulder";
          local_598[0x11] = local_5dc;
          local_598[0x12] = "rightshoulder";
          local_598[0x13] = local_5d8;
          local_598[0x14] = "leftstick";
          local_598[0x15] = local_5c8;
          local_598[0x16] = "rightstick";
          local_598[0x17] = local_5c4;
          local_598[0x18] = "dpup";
          local_598[0x19] = local_5c0;
          local_598[0x1a] = "dpright";
          local_598[0x1b] = local_5bc;
          local_598[0x1c] = "dpdown";
          local_598[0x1d] = local_5b8;
          local_598[0x1e] = "dpleft";
          local_598[0x1f] = local_5b4;
          local_598[0x20] = "lefttrigger";
          local_598[0x21] = (char *)&local_5a0;
          local_598[0x22] = "righttrigger";
          local_480 = (long)&local_5a0 + 4;
          local_478 = "leftx";
          local_470 = local_5b0;
          local_468 = "lefty";
          local_460 = local_5ac;
          local_458 = "rightx";
          local_450 = local_5a8;
          local_448 = "righty";
          local_440 = local_5a4;
          local_6a0 = (char *)&local_438;
          sVar13 = strcspn((char *)&local_438,",");
          if ((sVar13 == 0x20) && (local_418 == ',')) {
            local_5fd = local_428;
            uStack_5f5 = uStack_420;
            local_60d = local_438;
            uStack_605 = uStack_430;
            local_6a0 = local_417;
            sVar13 = strcspn(local_6a0,",");
            if ((sVar13 < 0x80) && (local_417[sVar13] == ',')) {
              memcpy(local_68d,local_417,sVar13);
              pcVar18 = local_417 + sVar13 + 1;
LAB_0010b1b9:
              cVar10 = *pcVar18;
              local_6a0 = pcVar18;
              if ((cVar10 != '-') && (cVar10 != '+')) {
                if (cVar10 != '\0') goto code_r0x0010b1dc;
                lVar19 = 0x80;
                do {
                  bVar20 = local_68d[lVar19] + 0xbf;
                  bVar21 = local_68d[lVar19 + 1] + 0xbf;
                  bVar22 = local_68d[lVar19 + 2] + 0xbf;
                  bVar23 = local_68d[lVar19 + 3] + 0xbf;
                  bVar24 = local_68d[lVar19 + 4] + 0xbf;
                  bVar25 = local_68d[lVar19 + 5] + 0xbf;
                  bVar26 = local_68d[lVar19 + 6] + 0xbf;
                  bVar27 = local_68d[lVar19 + 7] + 0xbf;
                  bVar2 = (byte)((5 < bVar20) * '\x05' | (5 >= bVar20) * bVar20) == bVar20;
                  bVar3 = (byte)((5 < bVar21) * '\x05' | (5 >= bVar21) * bVar21) == bVar21;
                  bVar4 = (byte)((5 < bVar22) * '\x05' | (5 >= bVar22) * bVar22) == bVar22;
                  bVar5 = (byte)((5 < bVar23) * '\x05' | (5 >= bVar23) * bVar23) == bVar23;
                  bVar6 = (byte)((5 < bVar24) * '\x05' | (5 >= bVar24) * bVar24) == bVar24;
                  bVar7 = (byte)((5 < bVar25) * '\x05' | (5 >= bVar25) * bVar25) == bVar25;
                  bVar8 = (byte)((5 < bVar26) * '\x05' | (5 >= bVar26) * bVar26) == bVar26;
                  bVar9 = (byte)((5 < bVar27) * '\x05' | (5 >= bVar27) * bVar27) == bVar27;
                  if (bVar2) {
                    local_68d[lVar19] = local_68d[lVar19] | 0x20;
                  }
                  if (bVar3) {
                    local_68d[lVar19 + 1] = local_68d[lVar19 + 1] | 0x20;
                  }
                  if (bVar4) {
                    local_68d[lVar19 + 2] = local_68d[lVar19 + 2] | 0x20;
                  }
                  if (bVar5) {
                    local_68d[lVar19 + 3] = local_68d[lVar19 + 3] | 0x20;
                  }
                  if (bVar6) {
                    local_68d[lVar19 + 4] = local_68d[lVar19 + 4] | 0x20;
                  }
                  if (bVar7) {
                    local_68d[lVar19 + 5] = local_68d[lVar19 + 5] | 0x20;
                  }
                  if (bVar8) {
                    local_68d[lVar19 + 6] = local_68d[lVar19 + 6] | 0x20;
                  }
                  if (bVar9) {
                    local_68d[lVar19 + 7] = local_68d[lVar19 + 7] | 0x20;
                  }
                  if (bVar2) {
                    local_68d[lVar19 + 8] = local_68d[lVar19 + 8] | 0x20;
                  }
                  if (bVar3) {
                    local_68d[lVar19 + 9] = local_68d[lVar19 + 9] | 0x20;
                  }
                  if (bVar4) {
                    local_68d[lVar19 + 10] = local_68d[lVar19 + 10] | 0x20;
                  }
                  if (bVar5) {
                    local_68d[lVar19 + 0xb] = local_68d[lVar19 + 0xb] | 0x20;
                  }
                  if (bVar6) {
                    local_68d[lVar19 + 0xc] = local_68d[lVar19 + 0xc] | 0x20;
                  }
                  if (bVar7) {
                    local_68d[lVar19 + 0xd] = local_68d[lVar19 + 0xd] | 0x20;
                  }
                  if (bVar8) {
                    local_68d[lVar19 + 0xe] = local_68d[lVar19 + 0xe] | 0x20;
                  }
                  if (bVar9) {
                    local_68d[lVar19 + 0xf] = local_68d[lVar19 + 0xf] | 0x20;
                  }
                  lVar19 = lVar19 + 0x10;
                } while (lVar19 != 0xa0);
                _glfwPlatformUpdateGamepadGUID((char *)&local_60d);
                p_Var16 = findMapping((char *)&local_60d);
                if (p_Var16 == (_GLFWmapping *)0x0) {
                  lVar19 = (long)_glfw.mappingCount;
                  _glfw.mappingCount = (int)(lVar19 + 1);
                  _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar19 + 1) * 0xf5);
                  p_Var16 = _glfw.mappings + (long)_glfw.mappingCount + -1;
                }
                memcpy(p_Var16,local_68d,0xf5);
              }
              goto LAB_0010b3a0;
            }
          }
          _glfwInputError(0x10004,(char *)0x0);
        }
LAB_0010b3a0:
        string = (char *)((byte *)string + sVar12);
      }
      else {
        sVar12 = strcspn(string,"\r\n");
        sVar13 = strspn((char *)((byte *)string + sVar12),"\r\n");
        string = (char *)((byte *)string + sVar12 + sVar13);
      }
      bVar20 = *string;
    }
    lVar19 = 0;
    do {
      if (*(int *)(_glfw.joysticks[0].guid + lVar19 + -0x48) != 0) {
        p_Var16 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].guid + lVar19 + -0x48));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar19 + -0xc) = p_Var16;
      }
      lVar19 = lVar19 + 0x1fa0;
    } while (lVar19 != 0x1fa00);
    iVar11 = 1;
  }
  return iVar11;
code_r0x0010b1dc:
  lVar19 = 8;
  do {
    pcVar1 = *(char **)((long)&local_5a0 + lVar19);
    sVar13 = strlen(pcVar1);
    iVar11 = strncmp(pcVar18,pcVar1,sVar13);
    if ((iVar11 == 0) && (pcVar18[sVar13] == ':')) {
      local_6a0 = pcVar18 + sVar13 + 1;
      pcVar1 = *(char **)((long)local_598 + lVar19);
      if (pcVar1 == (char *)0x0) {
        iVar11 = strncmp(local_6a0,"Linux",5);
        if (iVar11 != 0) goto LAB_0010b3a0;
        break;
      }
      if (*local_6a0 == '-') {
        local_694 = -1;
        local_6a0 = pcVar18 + sVar13 + 2;
        iVar11 = 0;
      }
      else {
        iVar11 = 1;
        if (*local_6a0 == '+') {
          local_6a0 = pcVar18 + sVar13 + 2;
          local_694 = 0;
        }
        else {
          local_694 = -1;
        }
      }
      cVar10 = *local_6a0;
      if (cVar10 == 'a') {
        bVar2 = false;
        cVar10 = '\x01';
      }
      else if (cVar10 == 'h') {
        cVar10 = '\x03';
        bVar2 = true;
      }
      else {
        if (cVar10 != 'b') break;
        cVar10 = '\x02';
        bVar2 = false;
      }
      *pcVar1 = cVar10;
      uVar14 = strtoul(local_6a0 + 1,&local_6a0,10);
      bVar20 = (byte)uVar14;
      if (bVar2) {
        uVar15 = strtoul(local_6a0 + 1,&local_6a0,10);
        bVar20 = (byte)(uVar14 << 4) | (byte)uVar15;
      }
      pcVar1[1] = bVar20;
      if (*pcVar1 == '\x01') {
        cVar10 = (char)(2 / (ulong)(uint)(iVar11 - local_694));
        pcVar1[2] = cVar10;
        cVar17 = (char)iVar11 + (char)local_694;
        pcVar1[3] = -cVar17;
        if (*local_6a0 == '~') {
          pcVar1[2] = -cVar10;
          pcVar1[3] = cVar17;
        }
      }
      break;
    }
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x168);
  pcVar18 = local_6a0;
  sVar13 = strcspn(local_6a0,",");
  pcVar18 = pcVar18 + sVar13;
  local_6a0 = pcVar18;
  sVar13 = strspn(pcVar18,",");
  pcVar18 = pcVar18 + sVar13;
  goto LAB_0010b1b9;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if ((*c >= '0' && *c <= '9') ||
            (*c >= 'a' && *c <= 'f') ||
            (*c >= 'A' && *c <= 'F'))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}